

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_eff_resist(parser *p)

{
  int iVar1;
  wchar_t wVar2;
  void *pvVar3;
  char *name;
  char *resist;
  blow_effect *eff;
  parser *p_local;
  
  pvVar3 = parser_priv(p);
  name = parser_getstr(p,"resist");
  if (pvVar3 == (void *)0x0) {
    __assert_fail("eff",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-init.c"
                  ,0x17e,"enum parser_error parse_eff_resist(struct parser *)");
  }
  iVar1 = strcmp(*(char **)((long)pvVar3 + 0x20),"element");
  if (iVar1 == 0) {
    wVar2 = proj_name_to_idx(name);
    *(wchar_t *)((long)pvVar3 + 0x28) = wVar2;
  }
  else {
    iVar1 = strcmp(*(char **)((long)pvVar3 + 0x20),"flag");
    if (iVar1 != 0) {
      return PARSE_ERROR_MISSING_BLOW_EFF_TYPE;
    }
    wVar2 = flag_index_by_name(name);
    *(wchar_t *)((long)pvVar3 + 0x28) = wVar2;
  }
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_eff_resist(struct parser *p) {
	struct blow_effect *eff = parser_priv(p);
	const char *resist = parser_getstr(p, "resist");
	assert(eff);

	if (streq(eff->effect_type, "element")) {
		eff->resist = proj_name_to_idx(resist);
	} else if (streq(eff->effect_type, "flag")) {
		eff->resist = flag_index_by_name(resist);
	} else {
		return PARSE_ERROR_MISSING_BLOW_EFF_TYPE;
	}
	return PARSE_ERROR_NONE;
}